

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

size_t convert<unsigned_int>(char *buf,uint value)

{
  uint uVar1;
  uint uVar2;
  char *__last;
  uint in_ESI;
  char *in_RDI;
  int lsd;
  char *p;
  uint i;
  char *pcVar3;
  
  pcVar3 = in_RDI;
  uVar1 = in_ESI;
  do {
    uVar2 = uVar1 % 10;
    uVar1 = uVar1 / 10;
    __last = pcVar3 + 1;
    *pcVar3 = zero[(int)uVar2];
    pcVar3 = __last;
  } while (uVar1 != 0);
  *__last = '\0';
  std::reverse<char*>((char *)((ulong)in_ESI << 0x20),__last);
  return (long)__last - (long)in_RDI;
}

Assistant:

size_t convert(char buf[], T value){
    T i = value;
    char* p=buf;

    do{
        int lsd=static_cast<int>(i%10);
        i /=10;
        *p++ = zero[lsd];
    }while(i!=0);

    if(value<0){
        *p++ = '-';
    }
    *p = '\0';
    std::reverse(buf, p);

    return p-buf;
}